

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase195::run(TestCase195 *this)

{
  byte *pbVar1;
  Orphanage OVar2;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  Builder root;
  Reader reader;
  MallocMessageBuilder builder;
  OrphanBuilder local_1a8;
  PointerBuilder local_188;
  StructBuilder local_168;
  ListReader local_140;
  Builder local_110;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  OVar2 = MessageBuilder::getOrphanage(&local_f8.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_140,OVar2.arena,OVar2.capTable,2,FOUR_BYTES);
  local_1a8.capTable = (CapTableBuilder *)local_140.ptr;
  local_1a8.tag.content = (uint64_t)local_140.segment;
  local_1a8.segment = (SegmentBuilder *)local_140.capTable;
  OrphanBuilder::asList((ListBuilder *)&local_140,&local_1a8,FOUR_BYTES);
  *(undefined4 *)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader = 0x7b;
  OrphanBuilder::asList((ListBuilder *)&local_140,&local_1a8,FOUR_BYTES);
  pbVar1 = (byte *)((long)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader +
                   (ulong)(local_140.step >> 3));
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  OrphanBuilder::asListReader(&local_140,&local_1a8,FOUR_BYTES);
  if (local_140.elementCount == 2) {
    if ((*(int *)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader != 0x7b) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_168.segment._0_4_ = 0x7b;
      local_188.segment =
           (SegmentBuilder *)
           CONCAT44(local_188.segment._4_4_,
                    *(undefined4 *)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader);
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcc,ERROR,"\"failed: expected \" \"(123u) == (reader[0])\", 123u, reader[0]",
                 (char (*) [39])"failed: expected (123u) == (reader[0])",(uint *)&local_168,
                 (uint *)&local_188);
    }
    if ((*(int *)((long)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader +
                 (ulong)(local_140.step >> 3)) != 0x1c8) && (kj::_::Debug::minSeverity < 3)) {
      local_168.segment._0_4_ = 0x1c8;
      local_188.segment =
           (SegmentBuilder *)
           CONCAT44(local_188.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((CapTableReader *)local_140.ptr)->_vptr_CapTableReader +
                     (ulong)(local_140.step >> 3)));
      kj::_::Debug::log<char_const(&)[39],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0xcd,ERROR,"\"failed: expected \" \"(456u) == (reader[1])\", 456u, reader[1]",
                 (char (*) [39])"failed: expected (456u) == (reader[1])",(uint *)&local_168,
                 (uint *)&local_188);
    }
    MessageBuilder::getRootInternal(&local_110,&local_f8.super_MessageBuilder);
    local_188.pointer = local_110.builder.pointer;
    local_188.capTable = local_110.builder.capTable;
    PointerBuilder::initStruct(&local_168,&local_188,(StructSize)0x140006);
    local_188.segment = (SegmentBuilder *)CONCAT44(local_168.segment._4_4_,local_168.segment._0_4_);
    local_188.pointer = local_168.pointers + 0xb;
    local_188.capTable = local_168.capTable;
    PointerBuilder::adopt(&local_188,&local_1a8);
    if (local_1a8.segment != (SegmentBuilder *)0x0) {
      OrphanBuilder::euthanize(&local_1a8);
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
    return;
  }
  local_188.segment = (SegmentBuilder *)CONCAT44(local_188.segment._4_4_,2);
  local_110.builder.segment._0_4_ = local_140.elementCount;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            ((Fault *)&local_168,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
             ,0xcb,FAILED,"(2u) == (reader.size())","2u, reader.size()",(uint *)&local_188,
             (uint *)&local_110);
  kj::_::Debug::Fault::fatal((Fault *)&local_168);
}

Assistant:

TEST(Orphans, OrphanageList) {
  MallocMessageBuilder builder;

  Orphan<List<uint32_t>> orphan = builder.getOrphanage().newOrphan<List<uint32_t>>(2);
  orphan.get().set(0, 123);
  orphan.get().set(1, 456);

  List<uint32_t>::Reader reader = orphan.getReader();
  ASSERT_EQ(2u, reader.size());
  EXPECT_EQ(123u, reader[0]);
  EXPECT_EQ(456u, reader[1]);

  auto root = builder.initRoot<TestAllTypes>();
  root.adoptUInt32List(kj::mv(orphan));
}